

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_4_statement(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_KEEP,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_4_statement(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define e G->val[-1]
#define b G->val[-2]
#define bl G->val[-3]
  yyprintf((stderr, "do yy_4_statement"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_KEEP, e); }\n"));
  yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_KEEP, e); ;
#undef e
#undef b
#undef bl
}